

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtw_stb_image.h
# Opt level: O0

uchar * __thiscall rtw_image::pixel_data(rtw_image *this,int x,int y)

{
  int iVar1;
  int iVar2;
  int y_local;
  int x_local;
  rtw_image *this_local;
  
  if (this->bdata == (uchar *)0x0) {
    this_local = (rtw_image *)pixel_data::magenta;
  }
  else {
    iVar1 = clamp(x,0,this->image_width);
    iVar2 = clamp(y,0,this->image_height);
    this_local = (rtw_image *)
                 (this->bdata +
                 (long)(iVar1 * this->bytes_per_pixel) + (long)(iVar2 * this->bytes_per_scanline));
  }
  return (uchar *)this_local;
}

Assistant:

const unsigned char* pixel_data(int x, int y) const {
        // Return the address of the three RGB bytes of the pixel at x,y. If there is no image
        // data, returns magenta.
        static unsigned char magenta[] = { 255, 0, 255 };
        if (bdata == nullptr) return magenta;

        x = clamp(x, 0, image_width);
        y = clamp(y, 0, image_height);

        return bdata + y*bytes_per_scanline + x*bytes_per_pixel;
    }